

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_true>_>_>
::_reduce_by_G(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_true>_>_>
               *this,Tmp_column *column,
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *chainsInH,Index currentIndex)

{
  uint uVar1;
  Column_settings *this_00;
  uint uVar2;
  long lVar3;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_true>_>_>
  *this_01;
  Index local_38;
  uint local_34;
  
  this_01 = (this->matrix_).
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_true>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + currentIndex;
  uVar2 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_true>_>_>
          ::get_pivot_value(this_01);
  this_00 = this->colSettings_;
  uVar1 = (this_00->operators).characteristic_;
  if (uVar1 <= uVar2) {
    uVar2 = uVar2 % uVar1;
  }
  local_34 = (this_00->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2];
  lVar3 = std::_Rb_tree_decrement(&(column->_M_t)._M_impl.super__Rb_tree_header._M_header);
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (&this_00->operators,&local_34,uVar1 - *(int *)(lVar3 + 0x24));
  _add_to(this,this_01,column,local_34);
  local_38 = (this_01->super_Chain_column_option).pairedColumn_;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int,unsigned_int&>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)chainsInH,&local_38,&local_34);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_G(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInH,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);                           // Reduce with the column col_g
    chainsInH.push_back(col.get_paired_chain_index());  // keep the col_h with which col_g is paired
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);                                       // Reduce with the column col_g
    chainsInH.emplace_back(col.get_paired_chain_index(), coef); // keep the col_h with which col_g is paired
  }
}